

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCollapsibleFrame.cpp
# Opt level: O0

void __thiscall QCollapsibleFrame::setTitle(QCollapsibleFrame *this,QWidget *title)

{
  bool bVar1;
  long in_RSI;
  long in_RDI;
  bool in_stack_0000000f;
  QCollapsibleFramePrivate *in_stack_00000010;
  QWidget *in_stack_ffffffffffffffc8;
  QWidget *pQVar2;
  QPointer<QWidget> *in_stack_ffffffffffffffd0;
  QCollapsibleFrame *in_stack_ffffffffffffffd8;
  QFlags<Qt::AlignmentFlag> local_14;
  long local_10;
  
  local_10 = in_RSI;
  bVar1 = ::operator!=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (bVar1) {
    takeTitle(in_stack_ffffffffffffffd8);
    if (local_10 != 0) {
      QPointer<QWidget>::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      pQVar2 = *(QWidget **)(*(long *)(in_RDI + 0x28) + 0x18);
      QFlags<Qt::AlignmentFlag>::QFlags(&local_14);
      QBoxLayout::addWidget(pQVar2,(int)local_10,(QFlags_conflict1 *)0x1);
      QAbstractButton::isChecked();
      QCollapsibleFramePrivate::button_toggled(in_stack_00000010,in_stack_0000000f);
    }
    titleChanged((QCollapsibleFrame *)0x1f22fd);
  }
  return;
}

Assistant:

void QCollapsibleFrame::setTitle(QWidget *title) {
    if (d->title != title) {
        /*delete*/ takeTitle();

        if (title) {
            d->title = title;
            d->horizontalLayout->addWidget(title, 1);
            d->button_toggled(d->button->isChecked());
        }

        Q_EMIT titleChanged();
    }
}